

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

void __thiscall QAccessibleTextEdit::setText(QAccessibleTextEdit *this,Text t,QString *text)

{
  bool bVar1;
  QTextEdit *in_RDX;
  uint in_ESI;
  QTextEdit *in_RDI;
  
  if (in_ESI == 2) {
    textEdit((QAccessibleTextEdit *)0x7e3c36);
    bVar1 = QTextEdit::isReadOnly(in_RDI);
    if (!bVar1) {
      textEdit((QAccessibleTextEdit *)0x7e3c50);
      QTextEdit::setText(in_RDX,(QString *)in_RDI);
    }
  }
  else {
    QAccessibleObject::setText((Text)in_RDI,(QString *)(ulong)in_ESI);
  }
  return;
}

Assistant:

void QAccessibleTextEdit::setText(QAccessible::Text t, const QString &text)
{
    if (t != QAccessible::Value) {
        QAccessibleWidget::setText(t, text);
        return;
    }
    if (textEdit()->isReadOnly())
        return;

    textEdit()->setText(text);
}